

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

Ref __thiscall gnilk::LogManager::GetOrAddLog(LogManager *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  iterator iVar1;
  mapped_type *pmVar2;
  __shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2> *this_01;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref RVar3;
  Ref instance;
  Ref writer;
  undefined1 local_70 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(name + 2))->__data);
  this_00 = &name[4].field_2;
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this_00,in_RDX);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    Log::Create((Log *)(local_70 + 0x10),in_RDX);
    std::__shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,(__shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x10));
    LogInstance::Create((LogInstance *)local_70,in_RDX,(Ref *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2> *)(local_70._0_8_ + 0x28));
    *(undefined1 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_40._M_ptr + 0x20))->
      _M_weak_count = *(undefined1 *)((long)&name->_M_string_length + 1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    this_01 = &std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00->_M_local_buf,in_RDX)->
               super___shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_01,(__shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2> *)local_70);
    std::__shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2> *)(local_70._0_8_ + 0x28));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  }
  else {
    pmVar2 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00->_M_local_buf,in_RDX);
    std::__shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2> *)this,
               &(((pmVar2->super___shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->logger).super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(name + 2));
  RVar3.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar3.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ref)RVar3.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Log::Ref LogManager::GetOrAddLog(const std::string &name) {
    std::lock_guard<std::mutex> lock(instLock);

    if (logInstances.find(name) != logInstances.end()) {
        return logInstances[name]->GetLog();
    }
    // Create the writer and the instance...
    auto writer = Log::Create(name);
    auto instance = LogInstance::Create(name, writer);

    instance->GetLog()->SetEnabled(enableLogOnCreate);

    logInstances[name] = instance;
    return instance->GetLog();
}